

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::tracker_announce_alert::~tracker_announce_alert(tracker_announce_alert *this)

{
  tracker_alert::~tracker_alert(&this->super_tracker_alert);
  operator_delete(this,0x98);
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_announce_alert final : tracker_alert
	{
		// internal
		tracker_announce_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, string_view u, int e);

		TORRENT_DEFINE_ALERT(tracker_announce_alert, 17)

		static constexpr alert_category_t static_category = alert_category::tracker;
		std::string message() const override;

		// specifies what event was sent to the tracker. It is defined as:
		//
		// 0. None
		// 1. Completed
		// 2. Started
		// 3. Stopped
		int const event;
	}